

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

uint8_t bf_get_uint8(bfile_t *bfile)

{
  bool_t bVar1;
  bfile_t *in_RDI;
  int bufpos;
  uint8_t *buffer;
  bfile_t *in_stack_00000010;
  uint8_t val;
  uint8_t local_1;
  
  bVar1 = bf_at_eof(in_RDI);
  if (bVar1 == 0) {
    if (in_RDI->ipos == in_RDI->pos) {
      bf_read_buffer(in_stack_00000010);
    }
    local_1 = in_RDI->buffer[(int)(in_RDI->pos % (ulong)in_RDI->buffer_size)];
    in_RDI->pos = in_RDI->pos + 1;
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

uint8_t
bf_get_uint8(
    bfile_t * bfile )
{
    uint8_t val;
    uint8_t * buffer;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    if ( bf_at_eof( bfile ) != FALSE )
        return 0;

    if ( (bfile->ipos - bfile->pos) < 1 ) 
        bf_read_buffer( bfile );

    buffer = bfile->buffer;
    bufpos = bfile->pos % bfile->buffer_size;
    val = buffer[bufpos];
    bfile->pos++;
    return val;
}